

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::CharSetInner::GetNextRange
          (CharSetInner *this,uint level,Char searchCharStart,Char *outLowerChar,Char *outHigherChar
          )

{
  ulong uVar1;
  CharSetNode *pCVar2;
  code *pcVar3;
  char cVar4;
  Char CVar5;
  Char CVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  byte bVar11;
  uint uVar12;
  undefined6 in_register_00000012;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ushort local_38;
  ushort local_36;
  Char local_34;
  Char local_32;
  Char tempLower;
  Char tempHigher;
  Char currentLowChar;
  Char currentHighChar;
  
  uVar15 = (uint)CONCAT62(in_register_00000012,searchCharStart);
  uVar13 = CONCAT62(in_register_00000012,searchCharStart) & 0xffffffff;
  cVar4 = (char)level * '\x04';
  if (uVar15 >> (cVar4 + 8U & 0x1f) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x28e,"(searchCharStart < this->lim(level) + 1)",
                       "searchCharStart < this->lim(level) + 1");
    if (!bVar7) goto LAB_00e6e79a;
    *puVar10 = 0;
  }
  bVar11 = cVar4 + 4;
  local_34 = L'\0';
  local_32 = L'\0';
  uVar12 = level - 1;
  bVar7 = true;
  uVar14 = (ulong)(uVar15 >> (bVar11 & 0x1f) & 0xf);
  do {
    pCVar2 = this->children[uVar14];
    if (pCVar2 != (CharSetNode *)0x0) {
      iVar9 = (*pCVar2->_vptr_CharSetNode[0xc])
                        (pCVar2,(ulong)uVar12,
                         (ulong)((uint)uVar13 & ~(-1 << ((char)level * '\x04' + 4U & 0x1f)) & 0xffff
                                ),&local_34,&local_32);
      if ((char)iVar9 != '\0') goto LAB_00e6e4c7;
    }
    uVar1 = uVar14 + 1;
    bVar7 = uVar14 < 0xf;
    if (uVar14 != 0xf) {
      uVar13 = (ulong)(uint)((int)uVar1 << (bVar11 & 0x1f));
    }
    uVar14 = uVar1;
  } while (uVar1 != 0x10);
  uVar14 = 0x10;
LAB_00e6e4c7:
  CVar5 = local_34;
  iVar9 = (int)uVar14;
  if (iVar9 != 0x10) {
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x112,"((index & innerMask) == index)","(index & innerMask) == index");
      if (!bVar8) goto LAB_00e6e79a;
      *puVar10 = 0;
    }
    if ((ushort)CVar5 >> (bVar11 & 0x1f) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x113,"((uint)(1 << ((level + 1) * bitsPerInnerLevel)) > offset)",
                         "(uint)(1 << ((level + 1) * bitsPerInnerLevel)) > offset");
      if (!bVar8) goto LAB_00e6e79a;
      *puVar10 = 0;
    }
    CVar6 = local_32;
    iVar16 = iVar9 << (bVar11 & 0x1f);
    local_34 = CVar5 + (short)iVar16;
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x112,"((index & innerMask) == index)","(index & innerMask) == index");
      if (!bVar7) goto LAB_00e6e79a;
      *puVar10 = 0;
    }
    if ((ushort)CVar6 >> (bVar11 & 0x1f) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x113,"((uint)(1 << ((level + 1) * bitsPerInnerLevel)) > offset)",
                         "(uint)(1 << ((level + 1) * bitsPerInnerLevel)) > offset");
      if (!bVar7) {
LAB_00e6e79a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    uVar15 = (uint)(ushort)CVar6 + iVar16;
    uVar17 = -1 << ((char)uVar12 * '\x04' + 8U & 0x1f);
    local_32 = (Char)uVar15;
    if (((uVar15 & 0xffff | uVar17) == 0xffffffff) && (iVar9 + 1U < 0x10)) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar14 = uVar14 & 0xffffffff;
      while (pCVar2 = this->children[uVar14 + 1], pCVar2 != (CharSetNode *)0x0) {
        iVar16 = (*pCVar2->_vptr_CharSetNode[0xc])(pCVar2,(ulong)uVar12,0,&local_38,&local_36);
        if (((char)iVar16 == '\0') || ((~uVar17 & (uint)local_38) != 0)) break;
        uVar15 = (uint)local_36;
        if (local_36 >> (bVar11 & 0x1f) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x113,"((uint)(1 << ((level + 1) * bitsPerInnerLevel)) > offset)",
                             "(uint)(1 << ((level + 1) * bitsPerInnerLevel)) > offset");
          if (!bVar7) goto LAB_00e6e79a;
          *puVar10 = 0;
        }
        uVar14 = uVar14 + 1;
        uVar15 = uVar15 + ((uint)uVar14 << (bVar11 & 0x1f));
        local_32 = (Char)uVar15;
        if (((uVar15 & 0xffff | uVar17) != 0xffffffff) || (0xe < (uint)uVar14)) break;
      }
    }
    *outLowerChar = local_34;
    *outHigherChar = local_32;
  }
  return iVar9 != 0x10;
}

Assistant:

bool CharSetInner::GetNextRange(uint level, Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar) const
    {
        Assert(searchCharStart < this->lim(level) + 1);
        uint innerIndex = innerIdx(level--, searchCharStart);

        Char currentLowChar = 0, currentHighChar = 0;

        for (; innerIndex < branchingPerInnerLevel; innerIndex++)
        {
            if (children[innerIndex] != nullptr && children[innerIndex]->GetNextRange(level, (Char)remain(level, searchCharStart), &currentLowChar, &currentHighChar))
            {
                break;
            }

            if (innerIndex < branchingPerInnerLevel - 1)
            {
                searchCharStart = (Char)indexToValue(level + 1, innerIndex + 1, 0);
            }
        }

        if (innerIndex == branchingPerInnerLevel)
        {
            return false;
        }

        currentLowChar = (Char)indexToValue(level + 1, innerIndex, currentLowChar);
        currentHighChar = (Char)indexToValue(level + 1, innerIndex, currentHighChar);

        innerIndex += 1;

        for (; remain(level, currentHighChar) == lim(level) && innerIndex < branchingPerInnerLevel; innerIndex++)
        {
            Char tempLower, tempHigher;
            if (children[innerIndex] == nullptr || !children[innerIndex]->GetNextRange(level, 0x0, &tempLower, &tempHigher) || remain(level, tempLower) != 0)
            {
                break;
            }

            currentHighChar = (Char)indexToValue(level + 1, innerIndex, tempHigher);
        }

        *outLowerChar = currentLowChar;
        *outHigherChar = currentHighChar;

        return true;
    }